

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O3

FT_Pointer ft_mem_qalloc(FT_Memory memory,FT_Long size,FT_Error *p_error)

{
  FT_Pointer pvVar1;
  int iVar2;
  
  if (size < 1) {
    pvVar1 = (FT_Pointer)0x0;
    iVar2 = 6;
    if (size == 0) {
      iVar2 = 0;
    }
  }
  else {
    pvVar1 = (*memory->alloc)(memory,size);
    iVar2 = (uint)(pvVar1 == (void *)0x0) << 6;
  }
  *p_error = iVar2;
  return pvVar1;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_qalloc( FT_Memory  memory,
                 FT_Long    size,
                 FT_Error  *p_error )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Pointer  block = NULL;


    if ( size > 0 )
    {
      block = memory->alloc( memory, size );
      if ( !block )
        error = FT_THROW( Out_Of_Memory );
    }
    else if ( size < 0 )
    {
      /* may help catch/prevent security issues */
      error = FT_THROW( Invalid_Argument );
    }

    *p_error = error;
    return block;
  }